

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# augmentedmatrix.cpp
# Opt level: O2

bool __thiscall
AugmentedMatrix::setMatrixData(AugmentedMatrix *this,fraction *valves,int width,int height)

{
  fraction *pfVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  this->width = width;
  this->height = height;
  uVar6 = 0;
  uVar5 = 0xffffffffffffffff;
  if (-1 < width) {
    uVar5 = (ulong)(uint)width << 4;
  }
  uVar4 = 0;
  if (0 < width) {
    uVar4 = (ulong)(uint)width;
  }
  uVar3 = (ulong)(uint)height;
  if (height < 1) {
    uVar3 = uVar6;
  }
  for (; uVar6 != uVar3; uVar6 = uVar6 + 1) {
    pfVar1 = (fraction *)operator_new__(uVar5);
    for (lVar2 = 0; uVar4 * 0x10 != lVar2; lVar2 = lVar2 + 0x10) {
      *(unkbyte10 *)((long)pfVar1 + lVar2) = *(unkbyte10 *)((long)valves + lVar2);
    }
    this->matrix[uVar6] = pfVar1;
    valves = valves + width;
  }
  return true;
}

Assistant:

bool AugmentedMatrix::setMatrixData(fraction *valves , int width, int height)
{
    this->width = width;
    this->height = height;

    for(int i=0 ; i<this->height ; i++)
    {
        fraction *x = new fraction[this->width];
        for(int j=0 ; j<this->width ; j++)
            x[j] = valves[i*this->width + j];
        matrix[i] = x;
    }

    return true;
}